

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O0

size_t __thiscall
phmap::priv::
parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<Int,_Int>,_Hash,_phmap::EqualTo<Int>,_std::allocator<std::pair<const_Int,_Int>_>_>
::bucket_count(parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<Int,_Int>,_Hash,_phmap::EqualTo<Int>,_std::allocator<std::pair<const_Int,_Int>_>_>
               *this)

{
  const_iterator pvVar1;
  size_t sVar2;
  DoNothing local_39;
  raw_hash_set<phmap::priv::FlatHashMapPolicy<Int,_Int>,_Hash,_phmap::EqualTo<Int>,_std::allocator<std::pair<const_Int,_Int>_>_>
  *prStack_38;
  SharedLock m;
  value_type *inner;
  const_iterator __end0;
  const_iterator __begin0;
  array<phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<Int,_Int>,_Hash,_phmap::EqualTo<Int>,_std::allocator<std::pair<const_Int,_Int>_>_>::Inner,_16UL>
  *__range3;
  size_t sz;
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<Int,_Int>,_Hash,_phmap::EqualTo<Int>,_std::allocator<std::pair<const_Int,_Int>_>_>
  *this_local;
  
  __range3 = (array<phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<Int,_Int>,_Hash,_phmap::EqualTo<Int>,_std::allocator<std::pair<const_Int,_Int>_>_>::Inner,_16UL>
              *)0x0;
  __end0 = std::
           array<phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<Int,_Int>,_Hash,_phmap::EqualTo<Int>,_std::allocator<std::pair<const_Int,_Int>_>_>::Inner,_16UL>
           ::begin(&this->sets_);
  pvVar1 = std::
           array<phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<Int,_Int>,_Hash,_phmap::EqualTo<Int>,_std::allocator<std::pair<const_Int,_Int>_>_>::Inner,_16UL>
           ::end(&this->sets_);
  for (; __end0 != pvVar1; __end0 = __end0 + 1) {
    prStack_38 = &__end0->set_;
    LockableBaseImpl<phmap::NullMutex>::DoNothing::
    DoNothing<phmap::priv::parallel_hash_set<4ul,phmap::priv::raw_hash_set,phmap::NullMutex,phmap::priv::FlatHashMapPolicy<phmap::priv::(anonymous_namespace)::ParallelFlatHashMap_StandardLayout_Test::TestBody()::Int,phmap::priv::(anonymous_namespace)::ParallelFlatHashMap_StandardLayout_Test::TestBody()::Int>,phmap::priv::(anonymous_namespace)::ParallelFlatHashMap_StandardLayout_Test::TestBody()::Hash,phmap::EqualTo<phmap::priv::(anonymous_namespace)::ParallelFlatHashMap_StandardLayout_Test::TestBody()::Int>,std::allocator<std::pair<phmap::priv::(anonymous_namespace)::ParallelFlatHashMap_StandardLayout_Test::TestBody()::Int_const,phmap::priv::(anonymous_namespace)::ParallelFlatHashMap_StandardLayout_Test::TestBody()::Int>>>::Inner&>
              (&local_39,__end0);
    sVar2 = raw_hash_set<phmap::priv::FlatHashMapPolicy<Int,_Int>,_Hash,_phmap::EqualTo<Int>,_std::allocator<std::pair<const_Int,_Int>_>_>
            ::bucket_count(prStack_38);
    __range3 = (array<phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<Int,_Int>,_Hash,_phmap::EqualTo<Int>,_std::allocator<std::pair<const_Int,_Int>_>_>::Inner,_16UL>
                *)((long)&__range3->_M_elems[0].set_.ctrl_ + sVar2);
  }
  return (size_t)__range3;
}

Assistant:

size_t bucket_count() const {
        size_t sz = 0;
        for (const auto& inner : sets_)
        {
            SharedLock m(const_cast<Inner&>(inner));
            sz += inner.set_.bucket_count();
        }
        return sz; 
    }